

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UChar * icu_63::ZoneMeta::findMetaZoneID(UnicodeString *mzid)

{
  UnicodeString *mzid_local;
  
  umtx_initOnce(&gMetaZoneIDsInitOnce,initAvailableMetaZoneIDs);
  if (gMetaZoneIDTable == (UHashtable *)0x0) {
    mzid_local = (UnicodeString *)0x0;
  }
  else {
    mzid_local = (UnicodeString *)uhash_get_63(gMetaZoneIDTable,mzid);
  }
  return (UChar *)mzid_local;
}

Assistant:

const UChar*
ZoneMeta::findMetaZoneID(const UnicodeString& mzid) {
    umtx_initOnce(gMetaZoneIDsInitOnce, &initAvailableMetaZoneIDs);
    if (gMetaZoneIDTable == NULL) {
        return NULL;
    }
    return (const UChar*)uhash_get(gMetaZoneIDTable, &mzid);
}